

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.h
# Opt level: O2

LPUTF8 utf8::EncodeTrueUtf8<false>
                 (char16 ch,char16 **source,charcount_t *cch,LPUTF8 ptr,void *bufferEnd)

{
  LPUTF8 puVar1;
  char16 surrogateHigh;
  
  if ((ushort)ch < 0x80) {
    CodexAssertOrFailFast(ptr < bufferEnd);
    *ptr = (utf8char_t)ch;
    puVar1 = ptr + 1;
  }
  else {
    if ((ushort)(ch + L'\x2000') < 0xf800) {
      puVar1 = EncodeFull<false>(ch,ptr,bufferEnd);
      return puVar1;
    }
    if ((*cch == 0) || ((**source & 0xfc00U) != 0xdc00 || 0xdbff < (ushort)ch)) {
      puVar1 = ptr + 3;
      CodexAssertOrFailFast(puVar1 <= bufferEnd);
      ptr[0] = 0xef;
      ptr[1] = 0xbf;
      ptr[2] = 0xbd;
    }
    else {
      puVar1 = EncodeSurrogatePair<false>(ch,**source,ptr);
      *source = *source + 1;
      *cch = *cch - 1;
    }
  }
  return puVar1;
}

Assistant:

inline LPUTF8 EncodeTrueUtf8(char16 ch, const char16** source, charcount_t* cch, _When_(!countBytesOnly, __out_ecount((*cch + 1) * 3)) LPUTF8 ptr, const void * bufferEnd)
    {
        if (ch < 0x80)
        {
            if (!countBytesOnly)
            {
                CodexAssertOrFailFast(ptr < bufferEnd);
                *ptr = static_cast<utf8char_t>(ch);
            }

            return ptr + 1;
        }
        else if (ch < 0xD800 || (ch >= 0xE000 && ch <= 0xFFFF))
        {
            return EncodeFull<countBytesOnly>(ch, ptr, bufferEnd);
        }

        // We're now decoding a surrogate pair. If the input is malformed (eg. low surrogate is absent)
        // we'll instead encode the unicode replacement character as utf8
        if (*cch > 0)
        {
            char16 surrogateHigh = ch;
            char16 surrogateLow = **source;

            // Validate that the surrogate code units are within the appropriate
            // ranges for high and low surrogates
            if ((surrogateHigh >= 0xD800 && surrogateHigh <= 0xDBFF) &&
                (surrogateLow >= 0xDC00 && surrogateLow <= 0xDFFF))
            {
                LPUTF8 retptr = EncodeSurrogatePair<countBytesOnly>(surrogateHigh, surrogateLow, ptr);

                // SAL analysis gets confused if we call EncodeSurrogatePair after
                // modifying cch

                // Consume the low surrogate
                *source = *source + 1;
                *cch = *cch - 1;

                return retptr;
            }
        }

        // Invalid input: insert the unicode replacement character instead
        if (!countBytesOnly)
        {
            CodexAssertOrFailFast(ptr + 3 <= bufferEnd);
            ptr[0] = 0xEF;
            ptr[1] = 0xBF;
            ptr[2] = 0xBD;
        }
        return ptr + 3;
    }